

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O2

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name,int fixed)

{
  char cVar1;
  StkId pSVar2;
  lu_byte lVar3;
  byte bVar4;
  Table *x__1;
  LClosure *o;
  Proto *f;
  char *why;
  LClosure *x_;
  int i;
  undefined4 uStack_6c;
  LoadState local_68;
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_68.fixed = (lu_byte)fixed;
  local_68.offset = 1;
  local_68.L = L;
  local_68.Z = Z;
  local_68.name = name;
  checkliteral(&local_68,"Lua","not a binary chunk");
  lVar3 = loadByte(&local_68);
  if (lVar3 == 'U') {
    lVar3 = loadByte(&local_68);
    if (lVar3 == '\0') {
      checkliteral(&local_68,anon_var_dwarf_de23,"corrupted chunk");
      checknumsize(&local_68,4,"int");
      loadBlock(&local_68,&i,4);
      checknumformat(&local_68,(uint)(i == -0x5678),"int");
      checknumsize(&local_68,4,"instruction");
      loadBlock(&local_68,&i,4);
      checknumformat(&local_68,(uint)(i == 0x12345678),"instruction");
      checknumsize(&local_68,8,"Lua integer");
      loadBlock(&local_68,&i,8);
      checknumformat(&local_68,(uint)(CONCAT44(uStack_6c,i) == -0x5678),"Lua integer");
      checknumsize(&local_68,8,"Lua number");
      loadBlock(&local_68,&i,8);
      checknumformat(&local_68,-(uint)((double)CONCAT44(uStack_6c,i) == -370.5) & 1,"Lua number");
      bVar4 = loadByte(&local_68);
      o = luaF_newLclosure(L,(uint)bVar4);
      pSVar2 = (L->top).p;
      *(LClosure **)pSVar2 = o;
      (pSVar2->val).tt_ = 'F';
      luaD_inctop(L);
      local_68.h = luaH_new(L);
      local_68.nstr = 0;
      pSVar2 = (L->top).p;
      (pSVar2->val).value_.gc = (GCObject *)local_68.h;
      (pSVar2->val).tt_ = 'E';
      luaD_inctop(L);
      f = luaF_newproto(L);
      o->p = f;
      if (((o->marked & 0x20) != 0) && ((f->marked & 0x18) != 0)) {
        luaC_barrier_(L,(GCObject *)o,(GCObject *)f);
        f = o->p;
      }
      loadFunction(&local_68,f);
      if (o->p->sizeupvalues == (uint)o->nupvalues) {
        (L->top).p = (StkId)((L->top).offset + -0x10);
        return o;
      }
      why = "corrupted chunk";
    }
    else {
      why = "format mismatch";
    }
  }
  else {
    why = "version mismatch";
  }
  error(&local_68,why);
}

Assistant:

LClosure *luaU_undump (lua_State *L, ZIO *Z, const char *name, int fixed) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  S.fixed = cast_byte(fixed);
  S.offset = 1;  /* fist byte was already read */
  checkHeader(&S);
  cl = luaF_newLclosure(L, loadByte(&S));
  setclLvalue2s(L, L->top.p, cl);
  luaD_inctop(L);
  S.h = luaH_new(L);  /* create list of saved strings */
  S.nstr = 0;
  sethvalue2s(L, L->top.p, S.h);  /* anchor it */
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  luaC_objbarrier(L, cl, cl->p);
  loadFunction(&S, cl->p);
  if (cl->nupvalues != cl->p->sizeupvalues)
    error(&S, "corrupted chunk");
  luai_verifycode(L, cl->p);
  L->top.p--;  /* pop table */
  return cl;
}